

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O0

void __thiscall
Buffer_make_contiguous_when_readonly_pages_Test::Buffer_make_contiguous_when_readonly_pages_Test
          (Buffer_make_contiguous_when_readonly_pages_Test *this)

{
  Buffer_make_contiguous_when_readonly_pages_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__Buffer_make_contiguous_when_readonly_pages_Test_001ed990;
  return;
}

Assistant:

TEST(Buffer, make_contiguous_when_readonly_pages) {
    auto constexpr n_pages_in = 2;
    auto constexpr begin = std::begin(strs);
    auto constexpr end = begin + n_pages_in;

    // setup: build a page with some read-only pages
    auto buf = bfy_buffer_init();
    auto const action = [&buf](auto const& str){bfy_buffer_add_readonly(&buf, std::data(str), std::size(str));};
    std::for_each(begin, end, action);
    auto const n_readable = bfy_buffer_get_content_len(&buf);
    auto const n_expected_readable = std::accumulate(begin, end, size_t{}, [](auto const& acc, auto const& str){return acc + std::size(str);});
    EXPECT_EQ(n_expected_readable, n_readable);
    EXPECT_EQ(n_pages_in, buffer_count_pages(&buf));

    // confirm that make_contiguous put 'em in one page
    auto const* rv = bfy_buffer_make_all_contiguous(&buf);
    EXPECT_EQ(1, buffer_count_pages(&buf));
    EXPECT_EQ(n_expected_readable, bfy_buffer_get_content_len(&buf));
    std::for_each(begin, end, [rv](auto const& str){ EXPECT_NE(std::data(str), rv); });

    bfy_buffer_destruct(&buf);
}